

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registered_type.cpp
# Opt level: O3

void __thiscall Am_Registered_Type::Print(Am_Registered_Type *this,ostream *out)

{
  int iVar1;
  
  iVar1 = (**this->_vptr_Am_Registered_Type)();
  Am_Standard_Print(out,(unsigned_long)this,(Am_ID_Tag)iVar1);
  return;
}

Assistant:

void
Am_Registered_Type::Print(std::ostream &out) const
{
#ifdef DEBUG
  const char *name = Am_Get_Name_Of_Item(this);
  if (name) {
    out << name;
    return;
  }
#endif

  //standard print if no name or not debugging
  Am_Standard_Print(out, (unsigned long)this, ID());
}